

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O2

void __thiscall
CFileCollection::BuildTimestring(CFileCollection *this,int64 Timestamp,char *pTimestring)

{
  pTimestring[0x13] = '\0';
  pTimestring[0x12] = (byte)Timestamp & 0xf | 0x30;
  pTimestring[0x11] = (byte)((Timestamp & 0xffffffffU) >> 4) & 0xf | 0x30;
  pTimestring[0x10] = '-';
  pTimestring[0xf] = (byte)((ulong)Timestamp >> 8) & 0xf | 0x30;
  pTimestring[0xe] = (byte)((ulong)Timestamp >> 0xc) & 0xf | 0x30;
  pTimestring[0xd] = '-';
  pTimestring[0xc] = (byte)((ulong)Timestamp >> 0x10) & 0xf | 0x30;
  pTimestring[0xb] = (byte)((ulong)Timestamp >> 0x14) & 0xf | 0x30;
  pTimestring[10] = '_';
  pTimestring[9] = (byte)((ulong)Timestamp >> 0x18) & 0xf | 0x30;
  pTimestring[8] = (byte)((ulong)Timestamp >> 0x1c) & 0xf | 0x30;
  pTimestring[7] = '-';
  pTimestring[6] = (byte)((ulong)Timestamp >> 0x20) & 0xf | 0x30;
  pTimestring[5] = (byte)((ulong)Timestamp >> 0x24) & 0xf | 0x30;
  pTimestring[4] = '-';
  pTimestring[3] = (byte)((ulong)Timestamp >> 0x28) & 0xf | 0x30;
  pTimestring[2] = (byte)((ulong)Timestamp >> 0x2c) & 0xf | 0x30;
  pTimestring[1] = (byte)((ulong)Timestamp >> 0x30) & 0xf | 0x30;
  *pTimestring = (byte)((ulong)Timestamp >> 0x34) & 0xf | 0x30;
  return;
}

Assistant:

void CFileCollection::BuildTimestring(int64 Timestamp, char *pTimestring)
{
	pTimestring[19] = 0;
	pTimestring[18] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[17] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[16] = '-';
	pTimestring[15] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[14] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[13] = '-';
	pTimestring[12] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[11] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[10] = '_';
	pTimestring[9] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[8] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[7] = '-';
	pTimestring[6] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[5] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[4] = '-';
	pTimestring[3] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[2] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[1] = (Timestamp&0xF)+'0'; Timestamp >>= 4;
	pTimestring[0] = (Timestamp&0xF)+'0';
}